

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O1

void pztopology::TPZPrism::ComputeHCurlDirections<double>
               (TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions,
               TPZVec<int> *transformationIds)

{
  long lVar1;
  int *piVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  int i_1;
  long lVar6;
  int i;
  long lVar7;
  long lVar8;
  long lVar9;
  TPZManVector<double,_3> v2;
  TPZManVector<double,_3> v1;
  TPZManVector<double,_3> v3;
  TPZFMatrix<double> axes;
  TPZVec<double> local_428;
  double adStack_408 [9];
  TPZManVector<double,_3> local_3c0;
  TPZManVector<double,_3> local_388;
  TPZVec<double> local_350;
  _func_int **pp_Stack_330;
  double local_328;
  double dStack_320;
  double local_318;
  double dStack_310;
  TPZVec<double> local_308;
  double adStack_2e8 [2];
  TPZVec<double> local_2d8;
  double adStack_2b8 [2];
  TPZManVector<double,_3> local_2a8;
  undefined **local_270;
  undefined **local_268;
  TPZFMatrix<double> local_260;
  TPZTransform<double> local_1d0;
  
  TPZManVector<double,_3>::TPZManVector(&local_388,3);
  TPZManVector<double,_3>::TPZManVector(&local_3c0,3);
  TPZManVector<double,_3>::TPZManVector(&local_2a8,3);
  lVar7 = 0;
  do {
    if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7) ||
       ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_388.super_TPZVec<double>.fStore[lVar7] = gradx->fElem[lVar7];
    if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7) ||
       ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    local_3c0.super_TPZVec<double>.fStore[lVar7] = gradx->fElem[lVar1 + lVar7];
    if ((lVar1 <= lVar7) || ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_2a8.super_TPZVec<double>.fStore[lVar7] =
         gradx->fElem[(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  TPZVec<double>::TPZVec(&local_428,0);
  local_428.fStore = adStack_408;
  local_268 = &PTR__TPZManVector_018a3060;
  local_428._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018a3060;
  local_428.fNElements = 9;
  local_428.fNAlloc = 0;
  adStack_408[0] = 0.0;
  adStack_408[1] = 0.0;
  adStack_408[2] = 0.0;
  adStack_408[3] = 0.0;
  adStack_408[4] = 0.0;
  adStack_408[5] = 0.0;
  adStack_408[6] = 0.0;
  adStack_408[7] = 0.0;
  adStack_408[8] = 0.0;
  TPZVec<double>::TPZVec(&local_350,0);
  local_350.fStore = (double *)&pp_Stack_330;
  local_270 = &PTR__TPZManVector_018a30b8;
  local_350._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018a30b8;
  local_350.fNElements = 5;
  local_350.fNAlloc = 0;
  pp_Stack_330 = (_func_int **)0x0;
  local_328 = 0.0;
  dStack_320 = 0.0;
  local_318 = 0.0;
  dStack_310 = 0.0;
  piVar2 = transformationIds->fStore;
  lVar7 = 0;
  do {
    local_428.fStore[lVar7] = (double)(int)(-(uint)(piVar2[lVar7] != 0) | 1);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 9);
  piVar2 = transformationIds->fStore;
  lVar7 = 4;
  do {
    (&local_350._vptr_TPZVec)[lVar7] = (_func_int **)(double)(int)(-(piVar2[lVar7 + 5] & 1U) | 1);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 9);
  lVar7 = 0;
  while( true ) {
    if (((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7) ||
       ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    directions->fElem[lVar7] = local_388.super_TPZVec<double>.fStore[lVar7] * *local_428.fStore;
    if (((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7) ||
       ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 + lVar7] =
         (local_388.super_TPZVec<double>.fStore[lVar7] +
         local_3c0.super_TPZVec<double>.fStore[lVar7]) * *local_428.fStore;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 2 + lVar7] =
         (local_3c0.super_TPZVec<double>.fStore[lVar7] * 1.4142135623730951 * local_428.fStore[1]) /
         1.4142135623730951;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 3 + lVar7] =
         (local_388.super_TPZVec<double>.fStore[lVar7] * -1.4142135623730951 * local_428.fStore[1])
         / 1.4142135623730951;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 4 + lVar7] =
         local_428.fStore[2] *
         -(local_388.super_TPZVec<double>.fStore[lVar7] +
          local_3c0.super_TPZVec<double>.fStore[lVar7]);
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 6)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 5 + lVar7] =
         local_428.fStore[2] * -local_3c0.super_TPZVec<double>.fStore[lVar7];
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 7)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 6 + lVar7] =
         local_2a8.super_TPZVec<double>.fStore[lVar7] * local_428.fStore[3] * 0.5;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 8)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 7 + lVar7] =
         local_2a8.super_TPZVec<double>.fStore[lVar7] * local_428.fStore[3] * 0.5;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 9)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 8 + lVar7] =
         local_2a8.super_TPZVec<double>.fStore[lVar7] * local_428.fStore[4] * 0.5;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 10)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 9 + lVar7] =
         local_2a8.super_TPZVec<double>.fStore[lVar7] * local_428.fStore[4] * 0.5;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xb))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 10 + lVar7] =
         local_2a8.super_TPZVec<double>.fStore[lVar7] * local_428.fStore[5] * 0.5;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xc))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0xb + lVar7] =
         local_2a8.super_TPZVec<double>.fStore[lVar7] * local_428.fStore[5] * 0.5;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xd))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0xc + lVar7] =
         local_388.super_TPZVec<double>.fStore[lVar7] * local_428.fStore[6];
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xe))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0xd + lVar7] =
         (local_388.super_TPZVec<double>.fStore[lVar7] +
         local_3c0.super_TPZVec<double>.fStore[lVar7]) * local_428.fStore[6];
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0xf))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0xe + lVar7] =
         (local_3c0.super_TPZVec<double>.fStore[lVar7] * 1.4142135623730951 * local_428.fStore[7]) /
         1.4142135623730951;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x10))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0xf + lVar7] =
         (local_388.super_TPZVec<double>.fStore[lVar7] * -1.4142135623730951 * local_428.fStore[7])
         / 1.4142135623730951;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x11))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x10 + lVar7] =
         local_428.fStore[8] *
         -(local_388.super_TPZVec<double>.fStore[lVar7] +
          local_3c0.super_TPZVec<double>.fStore[lVar7]);
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x12))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x11 + lVar7] =
         local_428.fStore[8] * -local_3c0.super_TPZVec<double>.fStore[lVar7];
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x13))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x12 + lVar7] =
         (local_3c0.super_TPZVec<double>.fStore[lVar7] * 0.5 +
         local_388.super_TPZVec<double>.fStore[lVar7]) * *local_428.fStore;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x14))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x13 + lVar7] =
         ((local_3c0.super_TPZVec<double>.fStore[lVar7] -
          local_388.super_TPZVec<double>.fStore[lVar7]) * 0.7071067811865476 * local_428.fStore[1])
         / 1.4142135623730951;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x15))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x14 + lVar7] =
         (local_388.super_TPZVec<double>.fStore[lVar7] * -0.5 -
         local_3c0.super_TPZVec<double>.fStore[lVar7]) * local_428.fStore[2];
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x16))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x15 + lVar7] =
         local_2a8.super_TPZVec<double>.fStore[lVar7] * local_428.fStore[3] * 0.5;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x17))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x16 + lVar7] =
         local_2a8.super_TPZVec<double>.fStore[lVar7] * local_428.fStore[4] * 0.5;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x18))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x17 + lVar7] =
         local_2a8.super_TPZVec<double>.fStore[lVar7] * local_428.fStore[5] * 0.5;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x19))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x18 + lVar7] =
         (local_3c0.super_TPZVec<double>.fStore[lVar7] * 0.5 +
         local_388.super_TPZVec<double>.fStore[lVar7]) * local_428.fStore[6];
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1a))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x19 + lVar7] =
         ((local_3c0.super_TPZVec<double>.fStore[lVar7] -
          local_388.super_TPZVec<double>.fStore[lVar7]) * 0.7071067811865476 * local_428.fStore[7])
         / 1.4142135623730951;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1b))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x1a + lVar7] =
         (local_388.super_TPZVec<double>.fStore[lVar7] * -0.5 -
         local_3c0.super_TPZVec<double>.fStore[lVar7]) * local_428.fStore[8];
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1c))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dVar3 = (double)pp_Stack_330 * *local_428.fStore * local_3c0.super_TPZVec<double>.fStore[lVar7];
    directions->fElem[lVar1 * 0x1b + lVar7] = dVar3 + dVar3;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1d))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dVar3 = (local_388.super_TPZVec<double>.fStore[lVar7] +
            local_3c0.super_TPZVec<double>.fStore[lVar7]) *
            local_428.fStore[1] * -(double)pp_Stack_330;
    directions->fElem[lVar1 * 0x1c + lVar7] = dVar3 + dVar3;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1e))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dVar3 = (double)pp_Stack_330 * local_428.fStore[2] *
            local_388.super_TPZVec<double>.fStore[lVar7];
    directions->fElem[lVar1 * 0x1d + lVar7] = dVar3 + dVar3;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x1f))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x1e + lVar7] =
         local_328 * *local_428.fStore * 0.5 * local_2a8.super_TPZVec<double>.fStore[lVar7] * 0.5;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x20))
    break;
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x1f + lVar7] =
         (local_388.super_TPZVec<double>.fStore[lVar7] +
         local_3c0.super_TPZVec<double>.fStore[lVar7]) * local_428.fStore[4] * local_328 * -0.5;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x21))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x20 + lVar7] =
         local_328 * local_428.fStore[6] * 0.5 * local_2a8.super_TPZVec<double>.fStore[lVar7] * 0.5;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x22))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x21 + lVar7] =
         local_328 * local_428.fStore[3] * local_388.super_TPZVec<double>.fStore[lVar7] * -0.5;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x23))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x22 + lVar7] =
         (dStack_320 * local_428.fStore[1] * 0.7071067811865476 *
         local_2a8.super_TPZVec<double>.fStore[lVar7]) / 2.8284271247461903;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x24))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x23 + lVar7] =
         (dStack_320 * local_428.fStore[5] * 1.4142135623730951 *
         local_388.super_TPZVec<double>.fStore[lVar7]) / 2.8284271247461903;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x25))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x24 + lVar7] =
         (dStack_320 * local_428.fStore[7] * 0.7071067811865476 *
         local_2a8.super_TPZVec<double>.fStore[lVar7]) / 2.8284271247461903;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x26))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x25 + lVar7] =
         (dStack_320 * local_428.fStore[4] * -1.4142135623730951 *
         local_3c0.super_TPZVec<double>.fStore[lVar7]) / 2.8284271247461903;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x27))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x26 + lVar7] =
         local_318 * local_428.fStore[2] * -0.5 * local_2a8.super_TPZVec<double>.fStore[lVar7] * 0.5
    ;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x28))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x27 + lVar7] =
         (local_388.super_TPZVec<double>.fStore[lVar7] +
         local_3c0.super_TPZVec<double>.fStore[lVar7]) * local_428.fStore[5] * local_318 * -0.5;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x29))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x28 + lVar7] =
         local_318 * local_428.fStore[8] * -0.5 * local_2a8.super_TPZVec<double>.fStore[lVar7] * 0.5
    ;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2a))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x29 + lVar7] =
         local_318 * local_428.fStore[3] * local_3c0.super_TPZVec<double>.fStore[lVar7] * -0.5;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2b))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dVar3 = dStack_310 * local_428.fStore[6] * local_3c0.super_TPZVec<double>.fStore[lVar7];
    directions->fElem[lVar1 * 0x2a + lVar7] = dVar3 + dVar3;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2c))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dVar3 = (local_388.super_TPZVec<double>.fStore[lVar7] +
            local_3c0.super_TPZVec<double>.fStore[lVar7]) * local_428.fStore[7] * -dStack_310;
    directions->fElem[lVar1 * 0x2b + lVar7] = dVar3 + dVar3;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x2d))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dVar3 = dStack_310 * local_428.fStore[8] * local_388.super_TPZVec<double>.fStore[lVar7];
    directions->fElem[lVar1 * 0x2c + lVar7] = dVar3 + dVar3;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x38))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x37 + lVar7] = -local_2a8.super_TPZVec<double>.fStore[lVar7];
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x39))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x38 + lVar7] = -local_3c0.super_TPZVec<double>.fStore[lVar7];
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x3a))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x39 + lVar7] =
         (local_388.super_TPZVec<double>.fStore[lVar7] +
         local_3c0.super_TPZVec<double>.fStore[lVar7]) * 0.7071067811865476;
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x3b))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x3a + lVar7] = -local_388.super_TPZVec<double>.fStore[lVar7];
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x3c))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x3b + lVar7] = local_2a8.super_TPZVec<double>.fStore[lVar7];
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x3d))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x3c + lVar7] = local_388.super_TPZVec<double>.fStore[lVar7];
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x3e))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar1 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    directions->fElem[lVar1 * 0x3d + lVar7] = local_3c0.super_TPZVec<double>.fStore[lVar7];
    if ((lVar1 <= lVar7) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 0x3f))
    {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    directions->fElem[(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 0x3e + lVar7]
         = local_2a8.super_TPZVec<double>.fStore[lVar7];
    lVar7 = lVar7 + 1;
    if (lVar7 == 3) {
      TPZVec<double>::TPZVec(&local_2d8,0);
      local_2d8.fStore = adStack_2b8;
      local_2d8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01843b78;
      local_2d8.fNElements = 2;
      local_2d8.fNAlloc = 0;
      adStack_2b8[0] = 0.0;
      adStack_2b8[1] = 0.0;
      TPZVec<double>::TPZVec(&local_308,0);
      local_308.fStore = adStack_2e8;
      local_308._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01843b78;
      local_308.fNElements = 2;
      local_308.fNAlloc = 0;
      adStack_2e8[0] = 0.0;
      adStack_2e8[1] = 0.0;
      lVar7 = 0;
      do {
        iVar4 = (int)lVar7;
        if (iVar4 - 1U < 3) {
          TPZQuadrilateral::ComputeHCurlFaceDirections<double>
                    (&local_2d8,&local_308,transformationIds->fStore[lVar7 + 9]);
        }
        else if ((iVar4 == 4) || (iVar4 == 0)) {
          TPZTriangle::ComputeHCurlFaceDirections<double>
                    (&local_2d8,&local_308,transformationIds->fStore[lVar7 + 9]);
        }
        lVar1 = lVar7 * 2 + 0x2d;
        if (((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
           ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar8 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        directions->fElem[lVar8 * lVar1] = 0.0;
        if ((lVar8 < 2) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar1)
           ) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar8 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        directions->fElem[lVar8 * lVar1 + 1] = 0.0;
        if ((lVar8 < 3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar1)
           ) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar8 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        directions->fElem[lVar8 * lVar1 + 2] = 0.0;
        lVar9 = lVar7 * 2 + 0x2e;
        if ((lVar8 < 1) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)
           ) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar8 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        directions->fElem[lVar8 * lVar9] = 0.0;
        if ((lVar8 < 2) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)
           ) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar8 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        directions->fElem[lVar8 * lVar9 + 1] = 0.0;
        if ((lVar8 < 3) || ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)
           ) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        directions->fElem
        [(directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar9 + 2] = 0.0;
        TransformElementToSide(&local_1d0,iVar4 + 0xf);
        TPZFMatrix<double>::TPZFMatrix(&local_260,&local_1d0.fMult.super_TPZFMatrix<double>);
        TPZTransform<double>::~TPZTransform(&local_1d0);
        TPZFMatrix<double>::Transpose(&local_260);
        lVar8 = 0;
        do {
          lVar6 = 0;
          do {
            if ((local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
               (local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8) ||
               ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar5 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar1;
            directions->fElem[lVar5 + lVar8] =
                 local_260.fElem
                 [local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar6 + lVar8] *
                 local_2d8.fStore[lVar6] + directions->fElem[lVar5 + lVar8];
            if ((local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
               (local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8) ||
               ((directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar5 = (directions->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar9;
            directions->fElem[lVar5 + lVar8] =
                 local_260.fElem
                 [local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar6 + lVar8] *
                 local_308.fStore[lVar6] + directions->fElem[lVar5 + lVar8];
            lVar6 = lVar6 + 1;
          } while (lVar6 == 1);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        TPZFMatrix<double>::~TPZFMatrix(&local_260);
        lVar7 = lVar7 + 1;
        if (lVar7 == 5) {
          if (local_308.fStore == adStack_2e8) {
            local_308.fStore = (double *)0x0;
          }
          local_308.fNAlloc = 0;
          local_308._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          if (local_308.fStore != (double *)0x0) {
            operator_delete__(local_308.fStore);
          }
          if (local_2d8.fStore == adStack_2b8) {
            local_2d8.fStore = (double *)0x0;
          }
          local_2d8.fNAlloc = 0;
          local_2d8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          if (local_2d8.fStore != (double *)0x0) {
            operator_delete__(local_2d8.fStore);
          }
          if ((_func_int ***)local_350.fStore == &pp_Stack_330) {
            local_350.fStore = (double *)0x0;
          }
          local_350.fNAlloc = 0;
          local_350._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          if ((_func_int ***)local_350.fStore != (_func_int ***)0x0) {
            operator_delete__(local_350.fStore);
          }
          if (local_428.fStore == adStack_408) {
            local_428.fStore = (double *)0x0;
          }
          local_428.fNAlloc = 0;
          local_428._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          if (local_428.fStore != (double *)0x0) {
            operator_delete__(local_428.fStore);
          }
          TPZManVector<double,_3>::~TPZManVector(&local_2a8);
          TPZManVector<double,_3>::~TPZManVector(&local_3c0);
          TPZManVector<double,_3>::~TPZManVector(&local_388);
          return;
        }
      } while( true );
    }
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZPrism::ComputeHCurlDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions, const TPZVec<int> &transformationIds)
    {
        TPZManVector<TVar,3> v1(3),v2(3),v3(3);

        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
            v3[i] = gradx(i,2);
        }
        constexpr auto nEdges = 9;
        constexpr auto nFaces = 5;
        //edges                      6,  7    ,8,9,10,11,12,   13,  14
        constexpr REAL edgeLength[nEdges]{1,M_SQRT2,1,2, 2, 2, 1,M_SQRT2,1};
        //faces                    15,16,    17,   18,19
        constexpr REAL faceArea[nFaces]{0.5,2,2*M_SQRT2,2,0.5};
        TPZManVector<REAL,nEdges> edgeSign(nEdges,0);
        TPZManVector<REAL,nFaces>  faceOrient(nFaces,0);

        for(auto iEdge = 0; iEdge < nEdges; iEdge++){
            edgeSign[iEdge] = transformationIds[iEdge] == 0 ? 1 : -1;
        }
        for(auto iFace = 0; iFace < nFaces; iFace++){
            faceOrient[iFace] = transformationIds[nEdges + iFace] % 2 == 0 ? 1 : -1;
        }
        for (int i=0; i<3; i++) {
            //v^{e,a} constant vector fields associated with edge e and vertex a
            //they are defined in such a way that v^{e,a} is normal to the edge \hat{e}
            //adjacent to edge e by the vertex a. the tangential component is set to be 1 /edgeLength[e]

            directions(i, 0) = (v1[i]) * edgeSign[0] / edgeLength[0];//edge 6  vertex 0
            directions(i, 1) = (v1[i] + v2[i]) * edgeSign[0] / edgeLength[0];//edge 6 vertex 1
            directions(i, 2) = (v2[i] * M_SQRT2) * edgeSign[1] / edgeLength[1];//edge 7 vertex 1
            directions(i, 3) = (-v1[i] * M_SQRT2) * edgeSign[1] / edgeLength[1];//edge 7 vertex 2
            directions(i, 4) = (v1[i] + v2[i]) * -1 * edgeSign[2] / edgeLength[2]; //edge 8 vertex 2
            directions(i, 5) = (-v2[i]) * edgeSign[2] / edgeLength[2]; //edge 8 vertex 0

            directions(i, 6) = v3[i] * edgeSign[3] / edgeLength[3];//edge 9 vertex 0
            directions(i, 7) = v3[i] * edgeSign[3] / edgeLength[3];//edge 9 vertex 3
            directions(i, 8) = v3[i] * edgeSign[4] / edgeLength[4];//edge 10 vertex 1
            directions(i, 9) = v3[i] * edgeSign[4] / edgeLength[4];//edge 10 vertex 4
            directions(i, 10) = v3[i] * edgeSign[5] / edgeLength[5];//edge 11 vertex 2
            directions(i, 11) = v3[i] * edgeSign[5] / edgeLength[5];//edge 11 vertex 5

            directions(i, 12) = (v1[i]) * edgeSign[6] / edgeLength[6];//edge 12 vertex 3
            directions(i, 13) = (v1[i] + v2[i]) * edgeSign[6] / edgeLength[6];//edge 12 vertex 4
            directions(i, 14) = (v2[i] * M_SQRT2) * edgeSign[7] / edgeLength[7];//edge 13 vertex 4
            directions(i, 15) = (-v1[i] * M_SQRT2) * edgeSign[7] / edgeLength[7];//edge 13 vertex 5
            directions(i, 16) = (v1[i] + v2[i]) * -1 * edgeSign[8] / edgeLength[8];//edge 14 vertex 5
            directions(i, 17) = (-v2[i]) * edgeSign[8] / edgeLength[8];//edge 14 vertex 3

            //v^{e,T} constant vector fields associated with edge e and aligned with it
            directions(i, 18) = (v1[i]+0.5*v2[i]) * edgeSign[0] / edgeLength[0];//edge 6
            directions(i, 19) = ((v2[i] - v1[i]) * M_SQRT1_2) * edgeSign[1] / edgeLength[1];//edge 7
            directions(i, 20) = (-0.5*v1[i]-v2[i]) * edgeSign[2] / edgeLength[2];//edge 8

            directions(i, 21) = v3[i] * edgeSign[3] / edgeLength[3];//edge 9
            directions(i, 22) = v3[i] * edgeSign[4] / edgeLength[4];//edge 10
            directions(i, 23) = v3[i] * edgeSign[5] / edgeLength[5];//edge 11

            directions(i, 24) = (v1[i]+0.5*v2[i]) * edgeSign[6] / edgeLength[6];//edge 12
            directions(i, 25) = ((v2[i] - v1[i]) * M_SQRT1_2) * edgeSign[7] / edgeLength[7];//edge 13
            directions(i, 26) = (-0.5*v1[i]-v2[i]) * edgeSign[8] / edgeLength[8];//edge 14

            //v^{F,e} constant vector fields associated with face F and edge e
            //they are defined in such a way that v^{F,e} is normal to the face \hat{F}
            //adjacent to face F by edge e
            directions(i, 27) = faceOrient[0] * edgeSign[6 - NCornerNodes] * v2[i]  / faceArea[0];//face 15 edge 6
            directions(i, 28) = faceOrient[0] * edgeSign[7 - NCornerNodes] * -1 * (v1[i] + v2[i])  / faceArea[0];//face 15 edge 7
            directions(i, 29) = faceOrient[0] * edgeSign[8 - NCornerNodes] * v1[i]  / faceArea[0];//face 15 edge 8

            directions(i, 30) = faceOrient[1] * edgeSign[6 - NCornerNodes] *  0.5 * v3[i] / faceArea[1];//face 16 edge 6
            directions(i, 31) = faceOrient[1] * edgeSign[10 - NCornerNodes] *  -1 * (v1[i]+v2[i]) / faceArea[1];//face 16 edge 10
            directions(i, 32) = faceOrient[1] * edgeSign[12 - NCornerNodes] *  0.5 * v3[i] / faceArea[1];;//face 16 edge 12
            directions(i, 33) = faceOrient[1] * edgeSign[9 - NCornerNodes] *  -v1[i] / faceArea[1];//face 16 edge 9

            directions(i, 34) = faceOrient[2] * edgeSign[7 - NCornerNodes] *  M_SQRT1_2 * v3[i] / faceArea[2];//face 17 edge 7
            directions(i, 35) = faceOrient[2] * edgeSign[11 - NCornerNodes] *  M_SQRT2 * v1[i] / faceArea[2];//face 17 edge 11
            directions(i, 36) = faceOrient[2] * edgeSign[13 - NCornerNodes] *  M_SQRT1_2 * v3[i] / faceArea[2];//face 17 edge 13
            directions(i, 37) = faceOrient[2] * edgeSign[10 - NCornerNodes] *  -M_SQRT2 * v2[i] / faceArea[2];//face 17 edge 10

            directions(i, 38) = faceOrient[3] * edgeSign[8 - NCornerNodes] * -0.5 * v3[i] / faceArea[3];//face 18 edge 8
            directions(i, 39) = faceOrient[3] * edgeSign[11 - NCornerNodes] *  -1 * (v1[i] + v2[i]) / faceArea[3];//face 18 edge 11
            directions(i, 40) = faceOrient[3] * edgeSign[14 - NCornerNodes] * -0.5 * v3[i] / faceArea[3];//face 18 edge 14
            directions(i, 41) = faceOrient[3] * edgeSign[9 - NCornerNodes] * -v2[i] / faceArea[3];//face 18 edge 9

            directions(i, 42) = faceOrient[4] * edgeSign[12 - NCornerNodes] * v2[i]  / faceArea[4];//face 19 edge 12
            directions(i, 43) = faceOrient[4] * edgeSign[13 - NCornerNodes] * -1 * (v1[i] + v2[i] )  / faceArea[4];//face 19 edge 13
            directions(i, 44) = faceOrient[4] * edgeSign[14 - NCornerNodes] * v1[i]  / faceArea[4];//face 19 edge 14

            //v^{F,T} are calculated afterwards

            //v^{F,orth} vector associated with face F and normal to it
            directions(i, 55) = -v3[i];//face 15
            directions(i, 56) = -v2[i];//face 16
            directions(i, 57) = (v1[i] + v2[i]) * M_SQRT1_2;//face 17
            directions(i, 58) = -v1[i];//face 18
            directions(i, 59) = v3[i];//face 19

            //v^{K,3}
            directions(i, 60) = v1[i];
            directions(i, 61) = v2[i];
            directions(i, 62) = v3[i];
        }

        TPZManVector<REAL,2> vft1(2,0), vft2(2,0);
        constexpr auto firstVftVec = 45;
        //v^{F,T} orthonormal vectors associated with face F and tangent to it.
        for(auto iFace = 0; iFace < nFaces; iFace ++){
            switch(iFace){
                case 0:
                case 4:
                    TPZTriangle::ComputeHCurlFaceDirections(vft1,vft2,transformationIds[nEdges + iFace]);
                    break;
                case 1:
                case 2:
                case 3:
                    TPZQuadrilateral::ComputeHCurlFaceDirections(vft1,vft2,transformationIds[nEdges + iFace]);
                    break;
            }
            directions(0,firstVftVec+2*iFace) = 0;directions(1,firstVftVec+2*iFace) = 0;directions(2,firstVftVec+2*iFace) = 0;
            directions(0,firstVftVec+2*iFace+1) = 0;directions(1,firstVftVec+2*iFace+1) = 0;directions(2,firstVftVec+2*iFace+1) = 0;
            auto axes = TPZPrism::TransformElementToSide(NCornerNodes+nEdges+iFace).Mult();
            axes.Transpose();
            for(auto x = 0; x < Dimension; x++){
                for(auto i = 0; i < 2; i++) {
                    directions(x, firstVftVec + 2 * iFace) += axes(x,i) * vft1[i];
                    directions(x, firstVftVec + 2 * iFace + 1) += axes(x,i) * vft2[i];
                }
            }
        }
    }